

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles2::Functional::createCaseGroup
               (TestCaseGroup *parent,char *groupName,char *groupDesc,TexFuncCaseSpec *cases,
               int numCases,bool isVertex)

{
  TestNode *node;
  TestContext *testCtx;
  ShaderTextureFunctionCase *this;
  Context *context;
  long lVar1;
  int local_48;
  int ndx;
  TestCaseGroup *group;
  bool isVertex_local;
  int numCases_local;
  TexFuncCaseSpec *cases_local;
  char *groupDesc_local;
  char *groupName_local;
  TestCaseGroup *parent_local;
  
  node = (TestNode *)operator_new(0x70);
  testCtx = tcu::TestNode::getTestContext((TestNode *)parent);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,groupName,groupDesc);
  tcu::TestNode::addChild((TestNode *)parent,node);
  for (local_48 = 0; local_48 < numCases; local_48 = local_48 + 1) {
    this = (ShaderTextureFunctionCase *)operator_new(0x200);
    context = TestCaseGroup::getContext(parent);
    lVar1 = (long)local_48;
    ShaderTextureFunctionCase::ShaderTextureFunctionCase
              (this,context,cases[lVar1].name,"",&cases[lVar1].lookupSpec,&cases[lVar1].texSpec,
               cases[lVar1].evalFunc,isVertex);
    tcu::TestNode::addChild(node,(TestNode *)this);
  }
  return;
}

Assistant:

static void createCaseGroup (TestCaseGroup* parent, const char* groupName, const char* groupDesc, const TexFuncCaseSpec* cases, int numCases, bool isVertex)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(parent->getTestContext(), groupName, groupDesc);
	parent->addChild(group);

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new ShaderTextureFunctionCase(parent->getContext(), cases[ndx].name, "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, isVertex));
}